

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O2

int __thiscall hiberlite::LoadBean::locateCol(LoadBean *this,string *name)

{
  __type_conflict _Var1;
  int iVar2;
  database_error *this_00;
  uint i;
  int N;
  _Elt_pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ppVar3 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar3 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar3 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  iVar2 = SQLiteSelect::column_count(&ppVar3[-1].first);
  N = 0;
  while( true ) {
    if (iVar2 == N) {
      this_00 = (database_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_70,name,": column not found in SELECT query results");
      database_error::database_error(this_00,&local_70);
      __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
    }
    SQLiteSelect::get_name_abi_cxx11_(&local_50,&ppVar3[-1].first,N);
    _Var1 = std::operator==(&local_50,name);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) break;
    N = N + 1;
  }
  return N;
}

Assistant:

inline int locateCol(std::string name){
			SQLiteSelect& sel=stmt.top().first;
			unsigned int n=sel.column_count();
			for(unsigned int i=0;i<n;i++)
			if(sel.get_name(i)==name)
				return i;
			throw database_error(name+": column not found in SELECT query results");
		}